

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall solitaire::Solitaire::tryPullOutCardFromFoundationPile(Solitaire *this,PileId *id)

{
  bool bVar1;
  uint *puVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined1 extraout_DL;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_68;
  _Storage<solitaire::cards::Card,_true> local_60;
  undefined4 local_58;
  _Storage<solitaire::cards::Card,_true> local_40;
  undefined4 local_38;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_30;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  snapshot;
  value_type *pile;
  PileId *local_18;
  PileId *id_local;
  Solitaire *this_local;
  
  local_18 = id;
  id_local = (PileId *)this;
  piles::PileId::PileId((PileId *)((long)&pile + 4),id);
  throwExceptionOnInvalidFoundationPileId(this,(PileId *)((long)&pile + 4));
  bVar1 = isGameInProgressAndHandIsEmpty(this);
  if (bVar1) {
    puVar2 = piles::PileId::operator_cast_to_unsigned_int_(id);
    snapshot._M_t.
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )std::array<std::shared_ptr<solitaire::piles::interfaces::FoundationPile>,_4UL>::
           operator[](&this->foundationPiles,(ulong)*puVar2);
    peVar3 = std::
             __shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)snapshot._M_t.
                             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                             .
                             super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>
                             ._M_head_impl);
    (*(peVar3->super_Archiver)._vptr_Archiver[2])(&local_30);
    peVar3 = std::
             __shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)snapshot._M_t.
                             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                             .
                             super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>
                             ._M_head_impl);
    local_60._0_4_ = (*(peVar3->super_Archiver)._vptr_Archiver[5])();
    local_60._M_value.suit = extraout_var;
    local_58 = CONCAT31(local_58._1_3_,extraout_DL);
    local_38 = local_58;
    local_40 = local_60;
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::unique_ptr(&local_68,&local_30);
    tryAddPulledOutCardToHand(this,(optional<solitaire::cards::Card> *)&local_40._M_value,&local_68)
    ;
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::~unique_ptr(&local_68);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::~unique_ptr(&local_30);
  }
  return;
}

Assistant:

void Solitaire::tryPullOutCardFromFoundationPile(const PileId id) {
    throwExceptionOnInvalidFoundationPileId(id);
    if (isGameInProgressAndHandIsEmpty()) {
        auto& pile = foundationPiles[id];
        auto snapshot = pile->createSnapshot();
        tryAddPulledOutCardToHand(pile->tryPullOutCard(), std::move(snapshot));
    }
}